

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O2

void __thiscall NJamSpell::TBloomFilter::Impl::Dump(Impl *this,ostream *out)

{
  NHandyPack::
  TVectorSerializer<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>::Dump
            (out,&(this->super_bloom_filter).salt_);
  NHandyPack::
  TVectorSerializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_unsigned_char>::Dump
            (out,&(this->super_bloom_filter).bit_table_);
  NHandyPack::TPodSerializer<unsigned_int>::Dump(out,&(this->super_bloom_filter).salt_count_);
  NHandyPack::TPodSerializer<unsigned_long_long>::Dump(out,&(this->super_bloom_filter).table_size_);
  NHandyPack::TPodSerializer<unsigned_long_long>::Dump
            (out,&(this->super_bloom_filter).projected_element_count_);
  NHandyPack::TPodSerializer<unsigned_long_long>::Dump
            (out,&(this->super_bloom_filter).inserted_element_count_);
  NHandyPack::TPodSerializer<unsigned_long_long>::Dump(out,&(this->super_bloom_filter).random_seed_)
  ;
  NHandyPack::TPodSerializer<double>::Dump
            (out,&(this->super_bloom_filter).desired_false_positive_probability_);
  return;
}

Assistant:

void Dump(std::ostream& out) const {
        NHandyPack::Dump(out, salt_, bit_table_, salt_count_, table_size_,
                        projected_element_count_, inserted_element_count_,
                        random_seed_, desired_false_positive_probability_);
    }